

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_transpose(matd_t *a)

{
  uint uVar1;
  uint uVar2;
  matd_t *pmVar3;
  int i;
  uint uVar4;
  int j;
  ulong uVar5;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x176,"matd_t *matd_transpose(const matd_t *)");
  }
  if (1 < a->nrows || 1 < a->ncols) {
    pmVar3 = matd_create(a->ncols,a->nrows);
    uVar1 = a->nrows;
    for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
      uVar2 = a->ncols;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        pmVar3[(ulong)(pmVar3->ncols * (int)uVar5 + uVar4) + 1] =
             a[(ulong)(uVar2 * uVar4 + (int)uVar5) + 1];
      }
    }
    return pmVar3;
  }
  pmVar3 = matd_create_scalar((double)a[1]);
  return pmVar3;
}

Assistant:

matd_t *matd_transpose(const matd_t *a)
{
    assert(a != NULL);

    if (matd_is_scalar(a))
        return matd_create_scalar(a->data[0]);

    matd_t *m = matd_create(a->ncols, a->nrows);

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(m, j, i) = MATD_EL(a, i, j);
        }
    }
    return m;
}